

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleLeggedOdometry.cpp
# Opt level: O2

bool __thiscall
iDynTree::SimpleLeggedOdometry::changeFixedFrame
          (SimpleLeggedOdometry *this,FrameIndex newFixedFrame,Transform *world_H_newFixedFrame)

{
  long lVar1;
  char *pcVar2;
  Transform newFixedFrame_H_newFixedLink;
  Transform aTStack_e8 [192];
  
  if (this->m_kinematicsUpdated == false) {
    pcVar2 = "changeFixedFrame was called, but the kinematics info was never setted.";
  }
  else {
    lVar1 = iDynTree::Model::getFrameLink((long)this);
    if (lVar1 != LINK_INVALID_INDEX) {
      iDynTree::Model::getFrameTransform((long)aTStack_e8);
      iDynTree::Transform::inverse();
      iDynTree::Transform::operator*(aTStack_e8,world_H_newFixedFrame);
      iDynTree::Transform::operator=(&this->m_world_H_fixedLink,aTStack_e8);
      this->m_fixedLinkIndex = lVar1;
      return true;
    }
    pcVar2 = "changeFixedFrame was called, but the provided new fixed frame is unknown.";
  }
  iDynTree::reportError("SimpleLeggedOdometry","changeFixedFrame",pcVar2);
  return false;
}

Assistant:

bool SimpleLeggedOdometry::changeFixedFrame(const FrameIndex newFixedFrame, const Transform & world_H_newFixedFrame)
{
    if( !this->m_kinematicsUpdated )
    {
        reportError("SimpleLeggedOdometry",
                    "changeFixedFrame",
                    "changeFixedFrame was called, but the kinematics info was never setted.");
        return false;
    }

    LinkIndex newFixedLink = this->m_model.getFrameLink(newFixedFrame);

    if( newFixedLink == LINK_INVALID_INDEX )
    {
        reportError("SimpleLeggedOdometry",
                    "changeFixedFrame",
                    "changeFixedFrame was called, but the provided new fixed frame is unknown.");
        return false;
    }

    Transform newFixedFrame_H_newFixedLink = m_model.getFrameTransform(newFixedFrame).inverse();
    this->m_world_H_fixedLink = world_H_newFixedFrame * newFixedFrame_H_newFixedLink;
    this->m_fixedLinkIndex = newFixedLink;

    return true;
}